

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::InvocationExpressionSyntax::getChild(InvocationExpressionSyntax *this,size_t index)

{
  long in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc0;
  nullptr_t in_stack_ffffffffffffffc8;
  
  if (in_RDX == 0) {
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x18));
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x20),in_stack_ffffffffffffffb8);
  }
  else if (in_RDX == 2) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax InvocationExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return left.get();
        case 1: return &attributes;
        case 2: return arguments;
        default: return nullptr;
    }
}